

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O3

void Gia_ManCompareValues(Gia_Man_t *p,Vec_Wrd_t *vSimsIn,Vec_Int_t *vValues,char *pDumpFile)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint Correct;
  ulong uVar8;
  int Counter;
  uint Guess;
  
  iVar4 = vSimsIn->nSize / p->vCis->nSize;
  iVar1 = vValues->nSize;
  if (iVar1 != iVar4 * 0x40) {
    __assert_fail("Vec_IntSize(vValues) == nWords * 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a1,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  Gia_ManSimulateWordsInit(p,vSimsIn);
  if (p->nSimWords != iVar4) {
    __assert_fail("p->nSimWords == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a3,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = *p->vCos->pArray;
  if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar5 = iVar2 * iVar4;
  if (((int)uVar5 < 0) || (p->vSims->nSize <= (int)uVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  iVar2 = vValues->nSize;
  uVar8 = (ulong)iVar2;
  Guess = 0;
  Correct = 0;
  if ((long)uVar8 < 1) {
LAB_0074a9c0:
    if (iVar4 < 0) goto LAB_0074a9de;
  }
  else {
    uVar7 = 0;
    Correct = 0;
    do {
      Correct = Correct + ((uint)((p->vSims->pArray[(ulong)uVar5 + (uVar7 >> 6 & 0x3ffffff)] >>
                                   (uVar7 & 0x3f) & 1) != 0) == vValues->pArray[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    if (iVar2 < 1) goto LAB_0074a9c0;
    piVar3 = vValues->pArray;
    uVar7 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + piVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    if (iVar6 != iVar4 * 0x20 && SBORROW4(iVar6,iVar4 * 0x20) == iVar6 + iVar4 * -0x20 < 0) {
      uVar7 = 0;
      Guess = 0;
      do {
        Guess = Guess + piVar3[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      goto LAB_0074a9de;
    }
    uVar7 = 0;
    Guess = 0;
    do {
      Guess = Guess + piVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  Guess = iVar1 - Guess;
LAB_0074a9de:
  printf("Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n"
         ,((double)(int)Correct * 100.0) / (double)iVar2,
         ((double)(int)Guess * 100.0) / (double)iVar2,uVar8,(ulong)(iVar2 - Correct),(ulong)Correct,
         (ulong)Guess);
  if (pDumpFile == (char *)0x0) {
    return;
  }
  Gia_ManSimLogStats(p,pDumpFile,vValues->nSize,Correct,Guess);
  printf("Finished dumping statistics into file \"%s\".\n",pDumpFile);
  return;
}

Assistant:

void Gia_ManCompareValues( Gia_Man_t * p, Vec_Wrd_t * vSimsIn, Vec_Int_t * vValues, char * pDumpFile )
{
    int i, Value, Guess, Count = 0, nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    word * pSims;
    assert( Vec_IntSize(vValues) == nWords * 64 );
    Gia_ManSimulateWordsInit( p, vSimsIn );
    assert( p->nSimWords == nWords );
    pSims = Gia_ManObjSim( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    Vec_IntForEachEntry( vValues, Value, i )
        if ( Abc_TtGetBit(pSims, i) == Value )
            Count++;
    Guess = (Vec_IntSum(vValues) > nWords * 32) ? Vec_IntSum(vValues) : nWords * 64 - Vec_IntSum(vValues);
    printf( "Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n", 
        Vec_IntSize(vValues), Vec_IntSize(vValues) - Count, 
        Count, 100.0*Count/Vec_IntSize(vValues),
        Guess, 100.0*Guess/Vec_IntSize(vValues));
    if ( pDumpFile == NULL )
        return;
    Gia_ManSimLogStats( p, pDumpFile, Vec_IntSize(vValues), Count, Guess );
    printf( "Finished dumping statistics into file \"%s\".\n", pDumpFile );
}